

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::handleExceptionMatchExpr
               (AssertionHandler *handler,StringMatcher *matcher,StringRef *matcherString)

{
  int iVar1;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar2;
  undefined4 extraout_var;
  string exceptionMessage;
  MatchExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Catch::Matchers::Impl::MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  expr;
  long *local_70 [2];
  long local_60 [2];
  undefined **local_50;
  undefined1 local_48;
  undefined1 local_47;
  long **local_40;
  StringMatcher *local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  pSVar2 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar1 = (*(pSVar2->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[5])(pSVar2);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
            (local_70,(long *)CONCAT44(extraout_var,iVar1));
  iVar1 = (**(matcher->
             super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             )._vptr_MatcherMethod)
                    (&matcher->
                      super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ,local_70);
  local_48 = 1;
  local_47 = (undefined1)iVar1;
  local_50 = &PTR_streamReconstructedExpression_005b2060;
  local_30 = *(undefined4 *)&matcherString->m_start;
  uStack_2c = *(undefined4 *)((long)&matcherString->m_start + 4);
  uStack_28 = (undefined4)matcherString->m_size;
  uStack_24 = *(undefined4 *)((long)&matcherString->m_size + 4);
  local_40 = local_70;
  local_38 = matcher;
  (*handler->m_resultCapture->_vptr_IResultCapture[10])
            (handler->m_resultCapture,handler,&local_50,&handler->m_reaction);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

void handleExceptionMatchExpr(AssertionHandler &handler, StringMatcher const &matcher, StringRef const &matcherString) {
    std::string exceptionMessage = Catch::translateActiveException();
    MatchExpr<std::string, StringMatcher const &> expr(exceptionMessage, matcher, matcherString);
    handler.handleExpr(expr);
  }